

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbwindow.cpp
# Opt level: O2

void __thiscall QFbWindow::setGeometry(QFbWindow *this,QRect *rect)

{
  bool bVar1;
  QWindow *pQVar2;
  long in_FS_OFFSET;
  QRect QVar3;
  undefined1 auVar4 [16];
  undefined8 local_38;
  int local_30;
  int local_2c;
  QRegion local_28 [8];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QVar3 = (QRect)(**(code **)(*(long *)this + 0x30))();
  this->mOldGeometry = QVar3;
  pQVar2 = (QWindow *)QPlatformWindow::window();
  QWindowSystemInterface::handleGeometryChange<QWindowSystemInterface::DefaultDelivery>(pQVar2,rect)
  ;
  QPlatformWindow::setGeometry((QRect *)this);
  bVar1 = operator!=(&this->mOldGeometry,rect);
  if (bVar1) {
    pQVar2 = (QWindow *)QPlatformWindow::window();
    auVar4 = (**(code **)(*(long *)this + 0x30))(this);
    local_30 = auVar4._8_4_ - auVar4._0_4_;
    local_38 = 0;
    local_2c = auVar4._12_4_ - auVar4._4_4_;
    QRegion::QRegion(local_28,&local_38,0);
    QWindowSystemInterface::handleExposeEvent<QWindowSystemInterface::DefaultDelivery>
              (pQVar2,local_28);
    QRegion::~QRegion(local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFbWindow::setGeometry(const QRect &rect)
{
    // store previous geometry for screen update
    mOldGeometry = geometry();

    QWindowSystemInterface::handleGeometryChange(window(), rect);

    QPlatformWindow::setGeometry(rect);

    if (mOldGeometry != rect)
        QWindowSystemInterface::handleExposeEvent(window(), QRect(QPoint(0, 0), geometry().size()));
}